

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamWriterPrivate::EncodeQuerySequence
          (BamWriterPrivate *this,string *query,string *encodedQuery)

{
  undefined8 uVar1;
  ulong in_RDX;
  string message;
  bool useHighWord;
  uchar nucleotideCode;
  char *pQuery;
  char *pEncodedQuery;
  size_t encodedQueryLength;
  size_t queryLength;
  undefined8 in_stack_ffffffffffffff20;
  RuleToken *in_stack_ffffffffffffff28;
  allocator *paVar2;
  allocator local_b9;
  string local_b8 [8];
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  BamException *in_stack_ffffffffffffff60;
  allocator local_81;
  string local_80 [70];
  bool local_3a;
  byte local_39;
  char *local_38;
  byte *local_30;
  ulong local_28;
  long local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = std::__cxx11::string::size();
  local_28 = local_20 + 1U >> 1;
  std::__cxx11::string::resize(local_18);
  local_30 = (byte *)std::__cxx11::string::data();
  local_38 = (char *)std::__cxx11::string::data();
  local_3a = true;
  for (; *local_38 != '\0'; local_38 = local_38 + 1) {
    switch(*local_38) {
    case '=':
      local_39 = 0;
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"invalid base: ",&local_81);
      std::operator+(in_stack_ffffffffffffff28,(char)((ulong)in_stack_ffffffffffffff20 >> 0x38));
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      uVar1 = __cxa_allocate_exception(0x28);
      paVar2 = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"BamWriter::EncodeQuerySequence",paVar2);
      BamException::BamException
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
    case 'A':
      local_39 = 1;
      break;
    case 'B':
      local_39 = 0xe;
      break;
    case 'C':
      local_39 = 2;
      break;
    case 'D':
      local_39 = 0xd;
      break;
    case 'G':
      local_39 = 4;
      break;
    case 'H':
      local_39 = 0xb;
      break;
    case 'K':
      local_39 = 0xc;
      break;
    case 'M':
      local_39 = 3;
      break;
    case 'N':
      local_39 = 0xf;
      break;
    case 'R':
      local_39 = 5;
      break;
    case 'S':
      local_39 = 6;
      break;
    case 'T':
      local_39 = 8;
      break;
    case 'V':
      local_39 = 7;
      break;
    case 'W':
      local_39 = 9;
      break;
    case 'Y':
      local_39 = 10;
    }
    local_3a = local_3a == false;
    if (local_3a) {
      *local_30 = *local_30 | local_39;
      local_30 = local_30 + 1;
    }
    else {
      *local_30 = local_39 << 4;
    }
  }
  return;
}

Assistant:

void BamWriterPrivate::EncodeQuerySequence(const std::string& query, std::string& encodedQuery)
{

    // prepare the encoded query string
    const std::size_t queryLength = query.size();
    const std::size_t encodedQueryLength = static_cast<std::size_t>((queryLength + 1) / 2);
    encodedQuery.resize(encodedQueryLength);
    char* pEncodedQuery = (char*)encodedQuery.data();
    const char* pQuery = (const char*)query.data();

    // walk through original query sequence, encoding its bases
    unsigned char nucleotideCode;
    bool useHighWord = true;
    while (*pQuery) {
        switch (*pQuery) {
            case (Constants::BAM_DNA_EQUAL):
                nucleotideCode = Constants::BAM_BASECODE_EQUAL;
                break;
            case (Constants::BAM_DNA_A):
                nucleotideCode = Constants::BAM_BASECODE_A;
                break;
            case (Constants::BAM_DNA_C):
                nucleotideCode = Constants::BAM_BASECODE_C;
                break;
            case (Constants::BAM_DNA_M):
                nucleotideCode = Constants::BAM_BASECODE_M;
                break;
            case (Constants::BAM_DNA_G):
                nucleotideCode = Constants::BAM_BASECODE_G;
                break;
            case (Constants::BAM_DNA_R):
                nucleotideCode = Constants::BAM_BASECODE_R;
                break;
            case (Constants::BAM_DNA_S):
                nucleotideCode = Constants::BAM_BASECODE_S;
                break;
            case (Constants::BAM_DNA_V):
                nucleotideCode = Constants::BAM_BASECODE_V;
                break;
            case (Constants::BAM_DNA_T):
                nucleotideCode = Constants::BAM_BASECODE_T;
                break;
            case (Constants::BAM_DNA_W):
                nucleotideCode = Constants::BAM_BASECODE_W;
                break;
            case (Constants::BAM_DNA_Y):
                nucleotideCode = Constants::BAM_BASECODE_Y;
                break;
            case (Constants::BAM_DNA_H):
                nucleotideCode = Constants::BAM_BASECODE_H;
                break;
            case (Constants::BAM_DNA_K):
                nucleotideCode = Constants::BAM_BASECODE_K;
                break;
            case (Constants::BAM_DNA_D):
                nucleotideCode = Constants::BAM_BASECODE_D;
                break;
            case (Constants::BAM_DNA_B):
                nucleotideCode = Constants::BAM_BASECODE_B;
                break;
            case (Constants::BAM_DNA_N):
                nucleotideCode = Constants::BAM_BASECODE_N;
                break;
            default:
                const std::string message = std::string("invalid base: ") + *pQuery;
                throw BamException("BamWriter::EncodeQuerySequence", message);
        }

        // pack the nucleotide code
        if (useHighWord) {
            *pEncodedQuery = nucleotideCode << 4;
            useHighWord = false;
        } else {
            *pEncodedQuery |= nucleotideCode;
            ++pEncodedQuery;
            useHighWord = true;
        }

        // increment the query position
        ++pQuery;
    }
}